

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O1

double __thiscall
NEST::NESTcalc::PhotonTime
          (NESTcalc *this,INTERACTION_TYPE species,bool exciton,double dfield,double energy)

{
  bool bVar1;
  RandomGen *pRVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_60;
  double local_48;
  double local_38;
  
  if (energy < 0.0134 || this->fdetector->inGas != false) {
    local_48 = 100.1;
    local_38 = 5.18;
  }
  else {
    local_48 = 23.97;
    local_38 = 3.27;
  }
  CalcElectronLET(this,energy,species,true);
  bVar1 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  dVar7 = energy;
  if (bVar1) {
    pRVar2 = RandomGen::rndm();
    local_38 = RandomGen::rand_gauss(pRVar2,6.0,0.8,true);
    pRVar2 = RandomGen::rndm();
    local_48 = RandomGen::rand_gauss(pRVar2,1500.0,50.0,true);
    if ((int)species < 6) {
      dVar4 = pow(energy / 41.78474,1.954878);
      local_60 = -1.5948417 / (dVar4 + 1.0) + 2.585833;
      pRVar2 = RandomGen::rndm();
      dVar4 = exp(dfield * -0.0066332);
      dVar4 = dVar4 * 57.6539;
    }
    else {
      if (species == ion) {
        dVar4 = exp(energy / -1000.0);
        local_60 = (dVar4 * 1.9996 + -0.065492) /
                   (0.082154 / ((energy / 1000.0) * (energy / 1000.0)) + 1.0) + 2.1811;
        goto LAB_001058b2;
      }
      dVar4 = pow(energy / 5.021868,1.426286);
      local_60 = 0.6818562 / (dVar4 + 1.0) + 0.3039284;
      pRVar2 = RandomGen::rndm();
      dVar4 = exp(dfield * -0.0066332);
      dVar4 = dVar4 * 314.014;
    }
    dVar4 = RandomGen::rand_gauss(pRVar2,dVar4,0.2,true);
  }
  else {
    if ((int)species < 6) {
      dVar4 = 0.0;
      local_60 = 0.269;
      if (exciton) {
        dVar4 = 0.5;
      }
      goto LAB_00105936;
    }
    if (species != ion) {
      local_48 = 25.89;
      dVar4 = 0.0;
      local_60 = 0.042;
      if (!exciton) {
        dVar7 = 1000.0;
        if (energy <= 1000.0) {
          dVar7 = energy;
        }
        dVar4 = exp(dfield * -0.009);
        dVar5 = log10(dVar7);
        dVar4 = (dVar5 * 3.8431 + 7.3138) * dVar4;
      }
      goto LAB_00105936;
    }
    local_60 = pow(energy,0.416);
    local_60 = local_60 * 0.065;
LAB_001058b2:
    dVar4 = 0.0;
  }
LAB_00105936:
  bVar1 = this->fdetector->inGas;
  if ((0.0134 <= dVar7 & (bVar1 ^ 1U)) == 0) {
    dVar4 = 0.0;
    if (!exciton) {
      dVar4 = 28000.0;
    }
    if (bVar1 == false) {
      dVar4 = 0.0;
    }
    bVar1 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
    local_60 = 0.1;
    if (bVar1) {
      local_38 = 6.0;
      local_48 = 1600.0;
    }
  }
  dVar7 = 0.0;
  if (0.0 <= dVar4) {
    dVar7 = dVar4;
  }
  pRVar2 = RandomGen::rndm();
  dVar4 = RandomGen::rand_uniform(pRVar2);
  pRVar2 = RandomGen::rndm();
  dVar5 = RandomGen::rand_uniform(pRVar2);
  pRVar2 = RandomGen::rndm();
  dVar6 = RandomGen::rand_uniform(pRVar2);
  dVar6 = log(dVar6);
  uVar3 = -(ulong)(dVar5 < local_60 / (local_60 + 1.0));
  return ((1.0 / dVar4 + -1.0) * dVar7 + 0.0) -
         (double)(~uVar3 & (ulong)local_48 | (ulong)local_38 & uVar3) * dVar6;
}

Assistant:

double NESTcalc::PhotonTime(INTERACTION_TYPE species, bool exciton,
                            double dfield, double energy) {
  double time_ns = 0., SingTripRatio = 0., tauR = 0., tau3 = 23.97,
         tau1 =
             3.27;  // arXiv:1802.06162. NR may need tauR ~0.5-1ns instead of 0
  if (fdetector->get_inGas() || energy < W_DEFAULT * 0.001) {
    // from G4S1Light.cc in old NEST
    tau1 = 5.18;   // uncertainty of 1.55 ns from G4S2Light
    tau3 = 100.1;  // uncertainty of 7.90 ns from G4S2Light
  }
  // tau1 = 3.5*ns; tau3 = 20.*ns; tauR = 40.*ns for solid Xe from old NEST.
  // Here assuming same as in liquid

  // if ( dfield > 60. ) dfield = 60. // makes Xed work. 200 for LUX Run04
  // instead. A mystery! Why no field dep?

  double LET = CalcElectronLET(energy, ATOM_NUM);
  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.)) {
    // copied from 2013 NEST version for LAr on LBNE
    tau1 = RandomGen::rndm()->rand_gauss(6, 0.8,
                                         true);  // error from weighted average
    tau3 = RandomGen::rndm()->rand_gauss(1500, 50, true);  // ibid.
    tauR = 0;
    if (species <= Cf) {
      SingTripRatio =(2.585833+(0.9909913-2.585833)/(1+pow(energy/41.78474, 1.954878)));
      tauR = RandomGen::rndm()->rand_gauss(57.6539*exp(-0.0066332*dfield), 0.2, true);
      }
    else if (species == ion) {  // really only alphas here
      SingTripRatio = (-0.065492 + 1.9996 * exp(-energy / 1e3)) /
                          (1. + 0.082154 / pow(energy / 1e3, 2.)) +
                      2.1811;  // uses energy in MeV not keV
    } else {
      SingTripRatio = 0.3039284 + (0.9857846 - 0.3039284)/(1 + pow((energy/5.021868),1.426286)); 
      tauR = RandomGen::rndm()->rand_gauss(314.014*exp(-0.0066332*dfield), 0.2, true);
    }  // lastly is ER for LAr
  } else {
    if (species <= Cf) {  // NR
      SingTripRatio = 0.269; if (exciton) tauR = 0.5;
    }
    else if (species == ion) {
      // e.g., alphas
      SingTripRatio =
          0.065 *
          pow(energy,
              0.416);  // spans 2.3 (alpha) and 7.8 (Cf in Xe) from NEST v1
    } else {
      tau3 = 25.89;  // ER
      if (!exciton) {
        if (energy > 1e3)
          energy = 1e3;  // MIP above ~1 MeV. Fix thanks to Austin de St. Croix
        tauR = exp(-0.00900 * dfield) *
               (7.3138 + 3.8431 * log10(energy));  // arXiv:1310.1117
        //if (tauR < 3.5) tauR = 3.5;  // gammas?
        if (dfield > 8e2) dfield = 8e2;  // to match Kubota's 4,000 V/cm
        SingTripRatio = 0.042;
      } else {
        SingTripRatio = 0.042; tauR = 0.;
      }
    }
  }
  if (fdetector->get_inGas() || energy < W_DEFAULT * 0.001) {
    SingTripRatio = 0.1;
    if (fdetector->get_inGas() && !exciton)
      tauR = 28e3;
    else {
      tauR = 0.;  // 28 microseconds comes from Henrique:
                  // https://doi.org/10.1016/j.astropartphys.2018.04.006
    }
    if (ValidityTests::nearlyEqual(ATOM_NUM, 18.)) {
      tau3 = 1600.;
      tau1 = 6.;
    }  // from old G4S2Light
  }
  if (tauR < 0.) tauR = 0.;  // in case varied with Gaussian earlier

  // the recombination time is non-exponential, but approximates
  // to exp at long timescales (see Kubota '79)
   time_ns += tauR * (1.0 / RandomGen::rndm()->rand_uniform() - 1.);

  if (RandomGen::rndm()->rand_uniform() < SingTripRatio / (1. + SingTripRatio))
    time_ns -= tau1 * log(RandomGen::rndm()->rand_uniform());
  else {
    time_ns -= tau3 * log(RandomGen::rndm()->rand_uniform());
  }

  return time_ns;
}